

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

int canvas_showtext(_glist *x)

{
  _binbuf *p_Var1;
  t_symbol *ptVar2;
  int iVar3;
  uint uVar4;
  t_atom *ptVar5;
  t_symbol *ptVar6;
  uint uVar7;
  
  p_Var1 = (x->gl_obj).te_binbuf;
  uVar7 = 1;
  if (p_Var1 != (_binbuf *)0x0) {
    ptVar5 = binbuf_getvec(p_Var1);
    p_Var1 = (x->gl_obj).te_binbuf;
    if (p_Var1 != (_binbuf *)0x0) {
      iVar3 = binbuf_getnatom(p_Var1);
      if ((iVar3 != 0) && (ptVar5->a_type == A_SYMBOL)) {
        ptVar2 = (ptVar5->a_w).w_symbol;
        ptVar6 = gensym("graph");
        uVar7 = (uint)(ptVar2 != ptVar6);
      }
    }
  }
  uVar4 = 0;
  if ((x->field_0xe9 & 2) == 0) {
    uVar4 = uVar7;
  }
  return uVar4;
}

Assistant:

int canvas_showtext(const t_canvas *x)
{
    t_atom *argv = (x->gl_obj.te_binbuf? binbuf_getvec(x->gl_obj.te_binbuf):0);
    int argc = (x->gl_obj.te_binbuf? binbuf_getnatom(x->gl_obj.te_binbuf) : 0);
    int isarray = (argc && argv[0].a_type == A_SYMBOL &&
        argv[0].a_w.w_symbol == gensym("graph"));
    if(x->gl_hidetext)
      return 0;
    else
      return (!isarray);
}